

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

SmallVector<diligent_spirv_cross::SPIRBlock::Case,_8UL> * __thiscall
diligent_spirv_cross::Compiler::get_case_list(Compiler *this,SPIRBlock *block)

{
  ID *__k;
  uint uVar1;
  Variant *pVVar2;
  ulong uVar3;
  SPIRConstant *pSVar4;
  SPIRConstantOp *pSVar5;
  SPIRType *pSVar6;
  __node_base_ptr p_Var7;
  CompilerError *this_00;
  SmallVector<diligent_spirv_cross::SPIRBlock::Case,_8UL> *pSVar8;
  uint32_t *puVar9;
  _Hash_node_base *p_Var10;
  
  uVar3 = (ulong)(block->condition).id;
  if ((uVar3 < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
     (pVVar2 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
     pVVar2[uVar3].type == TypeConstant)) {
    pSVar4 = Variant::get<diligent_spirv_cross::SPIRConstant>(pVVar2 + uVar3);
  }
  else {
    pSVar4 = (SPIRConstant *)0x0;
  }
  if (pSVar4 == (SPIRConstant *)0x0) {
    __k = &block->condition;
    uVar3 = (ulong)__k->id;
    if ((uVar3 < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
       (pVVar2 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
       pVVar2[uVar3].type == TypeConstantOp)) {
      pSVar5 = Variant::get<diligent_spirv_cross::SPIRConstantOp>(pVVar2 + uVar3);
    }
    else {
      pSVar5 = (SPIRConstantOp *)0x0;
    }
    if (pSVar5 == (SPIRConstantOp *)0x0) {
      uVar3 = (ulong)__k->id;
      if ((uVar3 < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
         (pVVar2 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
         pVVar2[uVar3].type == TypeVariable)) {
        pSVar4 = (SPIRConstant *)Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar2 + uVar3);
      }
      else {
        pSVar4 = (SPIRConstant *)0x0;
      }
      if (pSVar4 == (SPIRConstant *)0x0) {
        uVar3 = (ulong)__k->id;
        if ((uVar3 < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
           (pVVar2 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
           pVVar2[uVar3].type == TypeUndef)) {
          pSVar4 = (SPIRConstant *)Variant::get<diligent_spirv_cross::SPIRUndef>(pVVar2 + uVar3);
        }
        else {
          pSVar4 = (SPIRConstant *)0x0;
        }
        if (pSVar4 == (SPIRConstant *)0x0) {
          p_Var10 = (_Hash_node_base *)0x0;
          p_Var7 = ::std::
                   _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_unsigned_int>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::_M_find_before_node
                             (&(this->ir).load_type_width._M_h,
                              (ulong)__k->id % (this->ir).load_type_width._M_h._M_bucket_count,__k,
                              (ulong)__k->id);
          if (p_Var7 != (__node_base_ptr)0x0) {
            p_Var10 = p_Var7->_M_nxt;
          }
          if (p_Var10 == (_Hash_node_base *)0x0) {
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (this_00,"Use of undeclared variable on a switch statement.");
            __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          puVar9 = (uint32_t *)((long)&p_Var10[1]._M_nxt + 4);
          goto LAB_007c14a6;
        }
      }
      goto LAB_007c1458;
    }
    uVar1 = (pSVar5->basetype).id;
  }
  else {
LAB_007c1458:
    uVar1 = *(uint *)&(pSVar4->super_IVariant).field_0xc;
  }
  pSVar6 = Variant::get<diligent_spirv_cross::SPIRType>
                     ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr + uVar1);
  puVar9 = &pSVar6->width;
LAB_007c14a6:
  pSVar8 = &block->cases_64bit;
  if (*puVar9 < 0x21) {
    pSVar8 = &block->cases_32bit;
  }
  return pSVar8;
}

Assistant:

const SmallVector<SPIRBlock::Case> &Compiler::get_case_list(const SPIRBlock &block) const
{
	uint32_t width = 0;

	// First we check if we can get the type directly from the block.condition
	// since it can be a SPIRConstant or a SPIRVariable.
	if (const auto *constant = maybe_get<SPIRConstant>(block.condition))
	{
		const auto &type = get<SPIRType>(constant->constant_type);
		width = type.width;
	}
	else if (const auto *op = maybe_get<SPIRConstantOp>(block.condition))
	{
		const auto &type = get<SPIRType>(op->basetype);
		width = type.width;
	}
	else if (const auto *var = maybe_get<SPIRVariable>(block.condition))
	{
		const auto &type = get<SPIRType>(var->basetype);
		width = type.width;
	}
	else if (const auto *undef = maybe_get<SPIRUndef>(block.condition))
	{
		const auto &type = get<SPIRType>(undef->basetype);
		width = type.width;
	}
	else
	{
		auto search = ir.load_type_width.find(block.condition);
		if (search == ir.load_type_width.end())
		{
			SPIRV_CROSS_THROW("Use of undeclared variable on a switch statement.");
		}

		width = search->second;
	}

	if (width > 32)
		return block.cases_64bit;

	return block.cases_32bit;
}